

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

int __thiscall QScrollBarPrivate::pixelPosToRangeValue(QScrollBarPrivate *this,int pos)

{
  LayoutDirection LVar1;
  int iVar2;
  QScrollBar *pQVar3;
  QStyle *pQVar4;
  QScrollBarPrivate *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar5 [12];
  int sliderLength;
  int sliderMax;
  int sliderMin;
  QScrollBar *q;
  QRect sr;
  QRect gr;
  QStyleOptionSlider opt;
  QWidget *in_stack_ffffffffffffff18;
  QScrollBarPrivate *pQVar6;
  undefined1 local_88 [92];
  byte local_2c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  pQVar3 = q_func(in_RDI);
  memcpy(local_88,&DAT_00b22458,0x80);
  QStyleOptionSlider::QStyleOptionSlider((QStyleOptionSlider *)0x67d4e9);
  (**(code **)(*(long *)&(pQVar3->super_QAbstractSlider).super_QWidget + 0x1a8))(pQVar3,local_88);
  pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
  (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,2,local_88,0x80,pQVar3);
  pQVar4 = QWidget::style(in_stack_ffffffffffffff18);
  auVar5 = (**(code **)(*(long *)pQVar4 + 0xd8))(pQVar4,2,local_88,0x40,pQVar3);
  if ((in_RDI->super_QAbstractSliderPrivate).orientation == Horizontal) {
    QRect::width((QRect *)in_stack_ffffffffffffff18);
    QRect::x((QRect *)0x67d5d5);
    QRect::right((QRect *)0x67d5e3);
    LVar1 = QWidget::layoutDirection((QWidget *)0x67d5f8);
    if (LVar1 == RightToLeft) {
      local_2c = (local_2c ^ 0xff) & 1;
    }
  }
  else {
    QRect::height((QRect *)in_stack_ffffffffffffff18);
    QRect::y((QRect *)0x67d629);
    QRect::bottom((QRect *)0x67d637);
  }
  iVar2 = QStyle::sliderValueFromPosition
                    (auVar5._8_4_,auVar5._4_4_,auVar5._0_4_,(int)((ulong)pQVar6 >> 0x20),
                     SUB81((ulong)pQVar6 >> 0x18,0));
  QStyleOptionSlider::~QStyleOptionSlider((QStyleOptionSlider *)0x67d683);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QScrollBarPrivate::pixelPosToRangeValue(int pos) const
{
    Q_Q(const QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    QRect gr = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                          QStyle::SC_ScrollBarGroove, q);
    QRect sr = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                          QStyle::SC_ScrollBarSlider, q);
    int sliderMin, sliderMax, sliderLength;

    if (orientation == Qt::Horizontal) {
        sliderLength = sr.width();
        sliderMin = gr.x();
        sliderMax = gr.right() - sliderLength + 1;
        if (q->layoutDirection() == Qt::RightToLeft)
            opt.upsideDown = !opt.upsideDown;
    } else {
        sliderLength = sr.height();
        sliderMin = gr.y();
        sliderMax = gr.bottom() - sliderLength + 1;
    }

    return  QStyle::sliderValueFromPosition(minimum, maximum, pos - sliderMin,
                                            sliderMax - sliderMin, opt.upsideDown);
}